

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool validationCheck;
  bool allIntensityBinsCheck;
  bool bVar1;
  int iVar2;
  int maxDamageBinIdx;
  size_t sVar3;
  int extraout_EDX;
  bool useIndexFile;
  bool zip;
  sigaction sa;
  char idxFileName [4096];
  char binFileName [4096];
  string local_2110;
  string local_20f0;
  sigaction local_20d0;
  char local_2038 [4096];
  char local_1038 [4104];
  
  progname = *argv;
  memcpy(local_1038,"vulnerability.bin",0x1000);
  memcpy(local_2038,"vulnerability.idx",0x1000);
  maxDamageBinIdx = -1;
  validationCheck = true;
  zip = false;
  allIntensityBinsCheck = true;
  bVar1 = false;
  while( true ) {
    while( true ) {
      while( true ) {
        while (iVar2 = getopt(argc,argv,"d:izNShv"), iVar2 == 100) {
          maxDamageBinIdx = atoi(_optarg);
        }
        if (0x68 < iVar2) break;
        if (iVar2 == -1) {
          if (maxDamageBinIdx != -1) {
            useIndexFile = bVar1;
            if ((zip) && (useIndexFile = true, bVar1)) {
              main_cold_2();
            }
            memset(&local_20d0,0,0x98);
            sigemptyset(&local_20d0.sa_mask);
            local_20d0.__sigaction_handler.sa_handler = SegFaultSigAction;
            local_20d0.sa_flags = 4;
            sigaction(0xb,&local_20d0,(sigaction *)0x0);
            local_20f0._M_dataplus._M_p = (pointer)&local_20f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_20f0,"");
            local_2110._M_dataplus._M_p = (pointer)&local_2110.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2110,"");
            initstreams(&local_20f0,&local_2110);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2110._M_dataplus._M_p != &local_2110.field_2) {
              operator_delete(local_2110._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_20f0._M_dataplus._M_p != &local_20f0.field_2) {
              operator_delete(local_20f0._M_dataplus._M_p);
            }
            DoIt(maxDamageBinIdx,local_1038,local_2038,useIndexFile,zip,validationCheck,
                 allIntensityBinsCheck);
            return 0;
          }
          goto LAB_00104261;
        }
        if (iVar2 == 0x4e) {
          validationCheck = false;
        }
        else {
          if (iVar2 != 0x53) goto LAB_0010425c;
          allIntensityBinsCheck = false;
        }
      }
      if (iVar2 != 0x69) break;
      bVar1 = true;
    }
    if (iVar2 != 0x7a) break;
    sVar3 = strlen(local_1038);
    (local_1038 + sVar3)[0] = '.';
    (local_1038 + sVar3)[1] = 'z';
    local_1038[sVar3 + 2] = '\0';
    sVar3 = strlen(local_2038);
    (local_2038 + sVar3)[0] = '.';
    (local_2038 + sVar3)[1] = 'z';
    local_2038[sVar3 + 2] = '\0';
    zip = true;
  }
  if (iVar2 == 0x76) {
    main_cold_1();
  }
LAB_0010425c:
  main_cold_5();
LAB_00104261:
  main_cold_4();
  if (extraout_EDX == 1) {
    main_cold_3();
  }
  _Unwind_Resume();
}

Assistant:

int main(int argc, char *argv[]) {

  progname = argv[0];
  int maxDamageBinIdx = -1;
  char binFileName[4096] = "vulnerability.bin";
  char idxFileName[4096] = "vulnerability.idx";
  bool useIndexFile = false;
  bool zip = false;
  bool validationCheck = true;
  bool allIntensityBinsCheck = true;
  int opt;
  while ((opt = getopt(argc, argv, "d:izNShv")) != -1) {
    switch (opt) {
      case 'd':
        maxDamageBinIdx = atoi(optarg);
	break;
      case 'i':
	useIndexFile = true;
	break;
      case 'z':
	zip = true;
        strcat(binFileName, ".z");
	strcat(idxFileName, ".z");
	break;
      case 'N':
	validationCheck = false;
	break;
      case 'S':
	allIntensityBinsCheck = false;
	break;
      case 'v':
	fprintf(stderr, "%s : version : %s\n", argv[0], VERSION);
        exit(EXIT_FAILURE);
      case 'h':
      default:
	Help();
	exit(EXIT_FAILURE);
    }
  }

  if (maxDamageBinIdx == -1) {
    fprintf(stderr, "ERROR: Damage bin parameter not supplied.\n");
    exit(EXIT_FAILURE);
  }

  // There is no need for user to give command line argument for index file
  // creation when zip output is requested.
  if (zip) {
    if (useIndexFile) {
      fprintf(stderr, "INFO: Index files are always created when zip output is"
		      " requested.\n");
    }
    useIndexFile = zip;   // Ensure downstream conditionals work
  }

#if !defined(_MSC_VER) && !defined(__MINGW32__)
  struct sigaction sa;

  memset(&sa, 0, sizeof(struct sigaction));
  sigemptyset(&sa.sa_mask);
  sa.sa_sigaction = SegFaultSigAction;
  sa.sa_flags = SA_SIGINFO;

  sigaction(SIGSEGV, &sa, NULL);
#endif

  try {

    initstreams();
    DoIt(maxDamageBinIdx, binFileName, idxFileName, useIndexFile, zip,
	 validationCheck, allIntensityBinsCheck);
    return 0;

  } catch (std::bad_alloc&) {

    fprintf(stderr, "ERROR: %s: Memory allocation failed.\n", progname);
    exit(EXIT_FAILURE);

  }

}